

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_run_mode.h
# Opt level: O3

void __thiscall
charls::context_run_mode::update_variables
          (context_run_mode *this,int32_t error_value,int32_t e_mapped_error_value,
          uint8_t reset_threshold)

{
  byte bVar1;
  int iVar2;
  
  if (error_value < 0) {
    this->nn_ = this->nn_ + '\x01';
  }
  iVar2 = ((e_mapped_error_value - this->run_interruption_type_) + 1 >> 1) + this->a_;
  this->a_ = iVar2;
  bVar1 = this->n_;
  if (bVar1 == reset_threshold) {
    this->a_ = iVar2 >> 1;
    this->nn_ = this->nn_ >> 1;
    bVar1 = reset_threshold >> 1;
  }
  this->n_ = bVar1 + 1;
  return;
}

Assistant:

void update_variables(const int32_t error_value, const int32_t e_mapped_error_value,
                          const uint8_t reset_threshold) noexcept
    {
        if (error_value < 0)
        {
            ++nn_;
        }

        a_ += (e_mapped_error_value + 1 - run_interruption_type_) >> 1;

        if (n_ == reset_threshold)
        {
            a_ >>= 1;
            n_ = static_cast<uint8_t>(n_ >> 1);
            nn_ = static_cast<uint8_t>(nn_ >> 1);
        }

        ++n_;
    }